

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall
smf::MidiMessage::setMessage(MidiMessage *this,vector<int,_std::allocator<int>_> *message)

{
  pointer puVar1;
  int i;
  long lVar2;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (long)(message->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(message->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  for (lVar2 = 0;
      puVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar2 < *(int *)&(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (int)puVar1; lVar2 = lVar2 + 1) {
    puVar1[lVar2] =
         (uchar)(message->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar2];
  }
  return;
}

Assistant:

void MidiMessage::setMessage(const std::vector<int>& message) {
	resize(message.size());
	for (int i=0; i<(int)size(); i++) {
		(*this)[i] = (uchar)message[i];
	}
}